

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Light.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Lighting_DirectionalLight(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var_00;
  char *__s;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  CX3DImporter_NodeElement *pParentElement;
  long *plVar9;
  _List_node_base *p_Var10;
  long *plVar11;
  byte bVar12;
  string *psVar13;
  int pAttrIdx;
  ulong uVar14;
  CX3DImporter_NodeElement *ne;
  string use;
  string def;
  string an;
  bool local_269;
  float local_268;
  float local_264;
  CX3DImporter_NodeElement *local_258;
  pointer local_250;
  float local_248;
  aiColor3D local_240;
  undefined8 local_230;
  string local_228;
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  undefined4 extraout_var_01;
  
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_240.r = 1.0;
  local_240.g = 1.0;
  local_240.b = 1.0;
  local_250 = (pointer)0x0;
  local_248 = -1.0;
  local_258 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar7 < 1) {
    if (local_228._M_string_length == 0) {
      local_264 = 0.0;
      local_268 = 1.0;
      bVar12 = 0;
      goto LAB_005a3a5b;
    }
LAB_005a39d3:
    XML_CheckNode_MustBeEmpty(this);
    if (local_208._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_228,ENET_DirectionalLight,&local_258);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_228);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)local_258;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    plVar5 = &pCVar4->Child;
  }
  else {
    local_268 = 1.0;
    local_269 = true;
    uVar14 = 0;
    local_264 = 0.0;
    local_230 = 0;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar14;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar14);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,(char *)CONCAT44(extraout_var_00,iVar8),
                 (allocator<char> *)&local_1c8);
      iVar8 = std::__cxx11::string::compare((char *)local_1a8);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar8);
        psVar13 = &local_208;
LAB_005a38d8:
        pcVar3 = (char *)psVar13->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar13,0,pcVar3,(ulong)__s);
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)local_1a8);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_02,iVar8);
          psVar13 = &local_228;
          goto LAB_005a38d8;
        }
        iVar8 = std::__cxx11::string::compare((char *)local_1a8);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)local_1a8), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)local_1a8), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)local_1a8);
          if (iVar8 == 0) {
            local_264 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)local_1a8);
            if (iVar8 == 0) {
              XML_ReadNode_GetAttrVal_AsCol3f(this,pAttrIdx,&local_240);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)local_1a8);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsVec3f(this,pAttrIdx,(aiVector3D *)&local_250);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                if (iVar8 == 0) {
                  bVar6 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                  local_230 = CONCAT71(extraout_var,bVar6);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                  if (iVar8 == 0) {
                    local_268 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                    if (iVar8 == 0) {
                      local_269 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                    }
                    else {
                      Throw_IncorrectAttr(this,local_1a8);
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar14 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
    if (local_228._M_string_length != 0) goto LAB_005a39d3;
    if (local_269 == false) goto LAB_005a3d25;
    bVar12 = (byte)local_230 & 1;
LAB_005a3a5b:
    pParentElement = (CX3DImporter_NodeElement *)operator_new(0x98);
    pCVar4 = this->NodeElement_Cur;
    pParentElement->Type = ENET_DirectionalLight;
    (pParentElement->ID)._M_dataplus._M_p = (pointer)&(pParentElement->ID).field_2;
    (pParentElement->ID)._M_string_length = 0;
    (pParentElement->ID).field_2._M_local_buf[0] = '\0';
    pParentElement->Parent = pCVar4;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pParentElement->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_0089f720;
    *(undefined8 *)((long)&pParentElement[1]._vptr_CX3DImporter_NodeElement + 4) = 0;
    *(undefined8 *)&pParentElement[1].field_0xc = 0;
    *(undefined8 *)((long)&pParentElement[1].ID._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pParentElement[1].ID.field_2 + 4) = 0;
    *(undefined8 *)((long)&pParentElement[1].ID.field_2 + 0xc) = 0;
    *(undefined8 *)((long)&pParentElement[1].Parent + 4) = 0;
    local_258 = pParentElement;
    if (local_208._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x6d0a15);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_1b8 = *plVar11;
        lStack_1b0 = plVar9[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *plVar11;
        local_1c8 = (long *)*plVar9;
      }
      local_1c0 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&pParentElement->ID,(string *)&local_1c8);
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&pParentElement->ID);
    }
    *(float *)&pParentElement[1]._vptr_CX3DImporter_NodeElement = local_264;
    *(undefined8 *)((long)&pParentElement[1]._vptr_CX3DImporter_NodeElement + 4) = local_240._0_8_;
    *(ai_real *)&pParentElement[1].field_0xc = local_240.b;
    pParentElement[1].ID._M_dataplus._M_p = local_250;
    *(float *)&pParentElement[1].ID._M_string_length = local_248;
    *(byte *)((long)&pParentElement[1].ID._M_string_length + 4) = bVar12;
    *(float *)&pParentElement[1].ID.field_2 = local_268;
    ParseHelper_Group_Begin(this,false);
    std::__cxx11::string::_M_assign((string *)&this->NodeElement_Cur->ID);
    ParseHelper_Node_Exit(this);
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar8 == '\0') {
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"DirectionalLight","");
      ParseNode_Metadata(this,pParentElement,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = (_List_node_base *)pParentElement;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)pParentElement;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    plVar5 = &this->NodeElement_List;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
LAB_005a3d25:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Lighting_DirectionalLight()
{
    std::string def, use;
    float ambientIntensity = 0;
    aiColor3D color(1, 1, 1);
    aiVector3D direction(0, 0, -1);
    bool global = false;
    float intensity = 1;
    bool on = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ambientIntensity", ambientIntensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("color", color, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_REF("direction", direction, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("global", global, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("intensity", intensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("on", on, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_DirectionalLight, ne);
	}
	else
	{
		if(on)
		{
			// create and if needed - define new geometry object.
			ne = new CX3DImporter_NodeElement_Light(CX3DImporter_NodeElement::ENET_DirectionalLight, NodeElement_Cur);
			if(!def.empty())
				ne->ID = def;
			else
				ne->ID = "DirectionalLight_" + to_string((size_t)ne);// make random name

			((CX3DImporter_NodeElement_Light*)ne)->AmbientIntensity = ambientIntensity;
			((CX3DImporter_NodeElement_Light*)ne)->Color = color;
			((CX3DImporter_NodeElement_Light*)ne)->Direction = direction;
			((CX3DImporter_NodeElement_Light*)ne)->Global = global;
			((CX3DImporter_NodeElement_Light*)ne)->Intensity = intensity;
			// Assimp want a node with name similar to a light. "Why? I don't no." )
			ParseHelper_Group_Begin(false);

			NodeElement_Cur->ID = ne->ID;// assign name to node and return to light element.
			ParseHelper_Node_Exit();
			// check for child nodes
			if(!mReader->isEmptyElement())
				ParseNode_Metadata(ne, "DirectionalLight");
			else
				NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

			NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
		}// if(on)
	}// if(!use.empty()) else
}